

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FileDescriptorToBase64_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  char *in_RCX;
  undefined1 auVar1 [16];
  string_view input;
  compiler local_118 [8];
  FileDescriptorProto fdp;
  string local_38 [8];
  string fdp_bytes;
  FileDescriptor *descriptor_local;
  
  fdp_bytes.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  StripSourceRetentionOptions(local_118,(FileDescriptor *)fdp_bytes.field_2._8_8_,false);
  google::protobuf::MessageLite::SerializeToString((string *)local_118);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
  input._M_len = auVar1._8_8_;
  input._M_str = in_RCX;
  StringToBase64_abi_cxx11_(__return_storage_ptr__,auVar1._0_8_,input);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptorToBase64(const FileDescriptor* descriptor) {
  std::string fdp_bytes;
  FileDescriptorProto fdp = StripSourceRetentionOptions(*descriptor);
  fdp.SerializeToString(&fdp_bytes);
  return StringToBase64(fdp_bytes);
}